

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O1

bool __thiscall FIX::DataDictionary::isFieldValue(DataDictionary *this,int field,string *value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  string singleValue;
  key_type local_50;
  
  p_Var1 = &(this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_fieldValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < field]) {
    if (field <= (int)p_Var6[1]._M_color) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var6 = p_Var5, field < (int)p_Var5[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    bVar2 = false;
  }
  else {
    bVar2 = isMultipleValueField(this,field);
    if (bVar2) {
      do {
        lVar3 = std::__cxx11::string::find((char)value,0x20);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&p_Var6[1]._M_parent,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      } while ((lVar3 != -1) && (cVar4._M_node != (_Base_ptr)&p_Var6[1]._M_left));
      bVar2 = cVar4._M_node == (_Base_ptr)&p_Var6[1]._M_left;
    }
    else {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p_Var6[1]._M_parent,value);
      bVar2 = cVar4._M_node == (_Base_ptr)&p_Var6[1]._M_left;
    }
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool isFieldValue(int field, const std::string &value) const {
    FieldToValue::const_iterator i = m_fieldValues.find(field);
    if (i == m_fieldValues.end()) {
      return false;
    }
    if (!isMultipleValueField(field)) {
      return i->second.find(value) != i->second.end();
    }

    // MultipleValue
    std::string::size_type startPos = 0;
    std::string::size_type endPos = 0;
    do {
      endPos = value.find_first_of(' ', startPos);
      std::string singleValue = value.substr(startPos, endPos - startPos);
      if (i->second.find(singleValue) == i->second.end()) {
        return false;
      }
      startPos = endPos + 1;
    } while (endPos != std::string::npos);
    return true;
  }